

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByCamelcaseName(FileDescriptor *this,string *key)

{
  bool bVar1;
  FieldDescriptor *result;
  string *key_local;
  FileDescriptor *this_local;
  
  this_local = (FileDescriptor *)
               FileDescriptorTables::FindFieldByCamelcaseName
                         (*(FileDescriptorTables **)(this + 0xa8),this,key);
  if ((this_local == (FileDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)this_local), !bVar1)) {
    this_local = (FileDescriptor *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor*
FileDescriptor::FindExtensionByCamelcaseName(const string& key) const {
  const FieldDescriptor* result = tables_->FindFieldByCamelcaseName(this, key);
  if (result == NULL || !result->is_extension()) {
    return NULL;
  } else {
    return result;
  }
}